

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform.h
# Opt level: O2

bool senjo::StringParam(string *name,string *value,char **params,bool *invalid)

{
  char *pcVar1;
  bool bVar2;
  char *begin;
  
  bVar2 = ParamMatch(name,params);
  if (bVar2) {
    pcVar1 = *params;
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      *invalid = true;
    }
    else {
      NextSpace(params);
      std::__cxx11::string::assign((char *)value,(ulong)pcVar1);
      NextWord(params);
    }
  }
  return bVar2;
}

Assistant:

static inline bool StringParam(const std::string& name, std::string& value,
                               const char*& params, bool& invalid)
{
  if (!ParamMatch(name, params)) {
    return false;
  }
  if (!params || !*params) {
    invalid = true;
  }
  else {
    const char* begin = params;
    NextSpace(params);
    value.assign(begin, (params - begin));
    NextWord(params);
  }
  return true;
}